

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::RepeatedEnumFieldGenerator::GenerateSerializeWithCachedSizesToArray
          (RepeatedEnumFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  RepeatedEnumFieldGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&(this->super_FieldGenerator).variables_);
  bVar1 = FieldDescriptor::is_packed((this->super_FieldGenerator).descriptor_);
  if (bVar1) {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "{\n  int byte_size = _$name$_cached_byte_size_.load(std::memory_order_relaxed);\n  if (byte_size > 0) {\n    target = stream->WriteEnumPacked(\n        $number$, $name$_, byte_size, target);\n  }\n}\n"
              );
  }
  else {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "for (int i = 0, n = this->_internal_$name$_size(); i < n; i++) {\n  target = stream->EnsureSpace(target);\n  target = ::$proto_ns$::internal::WireFormatLite::WriteEnumToArray(\n      $number$, this->_internal_$name$(i), target);\n}\n"
              );
  }
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void RepeatedEnumFieldGenerator::GenerateSerializeWithCachedSizesToArray(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  if (descriptor_->is_packed()) {
    // Write the tag and the size.
    format(
        "{\n"
        "  int byte_size = "
        "_$name$_cached_byte_size_.load(std::memory_order_relaxed);\n"
        "  if (byte_size > 0) {\n"
        "    target = stream->WriteEnumPacked(\n"
        "        $number$, $name$_, byte_size, target);\n"
        "  }\n"
        "}\n");
  } else {
    format(
        "for (int i = 0, n = this->_internal_$name$_size(); i < n; i++) {\n"
        "  target = stream->EnsureSpace(target);\n"
        "  target = ::$proto_ns$::internal::WireFormatLite::WriteEnumToArray(\n"
        "      $number$, this->_internal_$name$(i), target);\n"
        "}\n");
  }
}